

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O2

float labpack_read_float(labpack_reader_t *reader)

{
  float fVar1;
  
  if (reader != (labpack_reader_t *)0x0) {
    if (reader->status == LABPACK_STATUS_OK) {
      fVar1 = mpack_expect_float(reader->decoder);
      labpack_reader_check_decoder(reader);
    }
    else {
      fVar1 = 0.0;
    }
    return fVar1;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0x10c,"float labpack_read_float(labpack_reader_t *)");
}

Assistant:

float
labpack_read_float(labpack_reader_t* reader)
{
    assert(reader);
    float value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_float(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}